

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::RemoveRelaxedDecoration(ConvertToHalfPass *this,uint32_t id)

{
  uint32_t id_00;
  bool bVar1;
  IRContext *this_00;
  DecorationManager *this_01;
  anon_class_1_0_00000001 local_39;
  function<bool_(const_spvtools::opt::Instruction_&)> local_38;
  uint32_t local_14;
  ConvertToHalfPass *pCStack_10;
  uint32_t id_local;
  ConvertToHalfPass *this_local;
  
  local_14 = id;
  pCStack_10 = this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_decoration_mgr(this_00);
  id_00 = local_14;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::ConvertToHalfPass::RemoveRelaxedDecoration(unsigned_int)::__0,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_38,&local_39);
  bVar1 = analysis::DecorationManager::RemoveDecorationsFrom(this_01,id_00,&local_38);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_38);
  return bVar1;
}

Assistant:

bool ConvertToHalfPass::RemoveRelaxedDecoration(uint32_t id) {
  return context()->get_decoration_mgr()->RemoveDecorationsFrom(
      id, [](const Instruction& dec) {
        if (dec.opcode() == spv::Op::OpDecorate &&
            spv::Decoration(dec.GetSingleWordInOperand(1u)) ==
                spv::Decoration::RelaxedPrecision) {
          return true;
        } else
          return false;
      });
}